

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubD::DumpTopology
          (ON_SubD *this,ON_2udex vertex_id_range,ON_2udex edge_id_range,ON_2udex face_id_range,
          ON_TextLog *text_log)

{
  uint uVar1;
  ON_2udex vertex_id_range_00;
  ON_2udex edge_id_range_00;
  ON_2udex face_id_range_00;
  bool bVar2;
  bool bVar3;
  ON_SubDTextureCoordinateType OVar4;
  ON_SubDTextureCoordinateType texture_coordinate_type;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ON_SubDimple *this_00;
  ON_SubDLevel *pOVar10;
  wchar_t *pwVar11;
  double dVar12;
  double dVar13;
  undefined8 in_stack_fffffffffffffa68;
  undefined4 uVar14;
  undefined8 in_stack_fffffffffffffa70;
  undefined4 uVar15;
  ON_2udex *local_538;
  ON_2udex *local_530;
  ON_2udex *local_528;
  bool local_4c7;
  bool local_4c6;
  bool local_4c5;
  bool local_4c3;
  bool local_4c1;
  ON__UINT64 local_478;
  ON__UINT64 local_470;
  ON__UINT64 local_468;
  ON_2udex level_face_id_range;
  ON_2udex level_edge_id_range;
  ON_2udex level_vertex_id_range;
  ON_TextLogIndent indent1_3;
  ON_SubDLevel *level;
  undefined1 local_400 [4];
  uint error_count;
  ON_SubDFaceIdIterator fidit;
  ON_SubDEdgeIdIterator eidit;
  ON_SubDVertexIdIterator vidit;
  ON_2udex empty_id_range;
  ON_SubDLevelIterator lit;
  ON_wString local_368;
  ON_wString local_360;
  ON_wString local_358;
  ON_wString local_350;
  size_t local_348;
  size_t sizeof_frags_waste;
  ON_wString local_338;
  ON_wString local_330;
  ON_wString local_328;
  ON_wString local_320;
  size_t local_318;
  size_t sizeof_frags;
  ON_wString local_308;
  ON_wString local_300;
  ON_wString local_2f8;
  ON_wString local_2f0;
  size_t local_2e8;
  size_t sizeof_subd;
  ON_TextLogIndent indent1_2;
  bool bIncludeSymmetrySet;
  ON_SHA1_Hash subd_fragment_color_settings_hash;
  LevelOfDetail lod;
  ON_MappingTag colors_tag;
  ON_TextLogIndent indent1_1;
  ON_SHA1_Hash frament_texture_settings_hash;
  ON_SHA1_Hash subd_texture_settings_hash;
  ON_TextLogIndent indent2;
  undefined1 local_1d0 [6];
  bool bSurfaceParameterMappingTag;
  bool bUnsetMappingTag;
  ON_MappingTag mapping_tag;
  undefined1 local_130 [7];
  bool bShowMappingTag;
  ON_wString subd_texture_coordinate_type_as_string;
  undefined1 local_110 [7];
  ON_SubDTextureCoordinateType subd_texture_coordinate_type;
  ON_TextLogIndent indent1;
  ON_SubDHash h;
  size_t i;
  uint local_90;
  ON_SubDHashType htype [3];
  ON_SubDEdgeSharpness OStack_8c;
  uint subd_sharp_edge_count;
  ON_SubDEdgeSharpness subd_sharpness_range;
  uint subd_face_count;
  uint subd_edge_count;
  uint subd_vertex_count;
  ON__UINT64 render_content_sn;
  ON__UINT64 geometry_content_sn;
  ON__UINT64 runtime_sn;
  bool bIsTextHash;
  uint active_level_index;
  uint level_count;
  ON_SubDimple *subdimple;
  ON_TextLog *text_log_local;
  ON_SubD *this_local;
  uint uStack_30;
  ON_2udex face_id_range_local;
  ON_2udex edge_id_range_local;
  ON_2udex vertex_id_range_local;
  
  uVar15 = (undefined4)((ulong)in_stack_fffffffffffffa70 >> 0x20);
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffa68 >> 0x20);
  unique0x100015d6 = face_id_range;
  face_id_range_local = edge_id_range;
  edge_id_range_local = vertex_id_range;
  this_00 = SubDimple(this);
  if (this_00 == (ON_SubDimple *)0x0) {
    ON_TextLog::Print(text_log,L"SubD: Empty\n");
    vertex_id_range_local.i = 0;
  }
  else {
    uVar6 = LevelCount(this);
    pOVar10 = ActiveLevel(this);
    uVar1 = pOVar10->m_level_index;
    bVar2 = ON_TextLog::IsTextHash(text_log);
    if (bVar2) {
      local_468 = 0;
      local_470 = 0;
      local_478 = 0;
    }
    else {
      local_468 = RuntimeSerialNumber(this);
      local_470 = GeometryContentSerialNumber(this);
      local_478 = RenderContentSerialNumber(this);
    }
    uVar7 = VertexCount(this);
    uVar8 = EdgeCount(this);
    uVar9 = FaceCount(this);
    if (uVar6 < 2) {
      ON_TextLog::Print(text_log,L"SubD[%lu]: %u vertices, %u edges, %u faces\n",local_468,
                        (ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
    }
    else {
      ON_TextLog::Print(text_log,
                        L"SubD[%lu]: %u levels. Level %u is active (%u vertices, %u edges, %u faces).\n"
                        ,local_468,(ulong)uVar6,(ulong)uVar1,(ulong)uVar7,CONCAT44(uVar14,uVar8),
                        CONCAT44(uVar15,uVar9));
    }
    OStack_8c = (ON_SubDEdgeSharpness)(float  [2])0x0;
    local_90 = SharpEdgeCount(this,&stack0xffffffffffffff74);
    if (local_90 != 0) {
      ON_TextLog::PushIndent(text_log);
      bVar3 = ON_SubDEdgeSharpness::IsConstant(&stack0xffffffffffffff74);
      uVar6 = local_90;
      if (bVar3) {
        if (local_90 == 1) {
          ON_SubDEdgeSharpness::operator[](&stack0xffffffffffffff74,0);
          ON_TextLog::Print(text_log,L"1 sharp edge with end sharpness = %g.\n");
        }
        else {
          ON_SubDEdgeSharpness::operator[](&stack0xffffffffffffff74,0);
          ON_TextLog::Print(text_log,L"%u sharp edges with end sharpness = %g.\n",(ulong)uVar6);
        }
      }
      else {
        dVar12 = ON_SubDEdgeSharpness::operator[](&stack0xffffffffffffff74,0);
        dVar13 = ON_SubDEdgeSharpness::operator[](&stack0xffffffffffffff74,1);
        ON_TextLog::Print(text_log,L"%u sharp edges with end sharpnesses from %g to %g.\n",dVar12,
                          SUB84(dVar13,0),(ulong)uVar6);
      }
      ON_TextLog::PopIndent(text_log);
    }
    i._5_2_ = 0x103;
    i._7_1_ = 2;
    h.m_face_hash.m_digest[0x10] = '\0';
    h.m_face_hash.m_digest[0x11] = '\0';
    h.m_face_hash.m_digest[0x12] = '\0';
    h.m_face_hash.m_digest[0x13] = '\0';
    h._92_4_ = 0;
    for (; (ulong)h._88_8_ < 3; h._88_8_ = h._88_8_ + 1) {
      SubDHash((ON_SubDHash *)&indent1.m_bEnabled,this,*(ON_SubDHashType *)((long)&i + h._88_8_ + 5)
               ,false);
      ON_SubDHash::Dump((ON_SubDHash *)&indent1.m_bEnabled,text_log);
    }
    if (!bVar2) {
      ON_TextLog::Print(text_log,L"Texture coordinate settings:\n");
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_110,text_log);
      OVar4 = TextureCoordinateType(this);
      texture_coordinate_type = TextureCoordinateType(this);
      TextureCoordinateTypeToString((ON_SubD *)local_130,texture_coordinate_type);
      pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_130);
      ON_TextLog::Print(text_log,L"TextureCoordinateType() = %ls\n",pwVar11);
      local_4c1 = !bVar2 || OVar4 == FromMapping;
      mapping_tag.m_mesh_xform.m_xform[3][3]._7_1_ = local_4c1;
      if (!bVar2 || OVar4 == FromMapping) {
        TextureMappingTag((ON_MappingTag *)local_1d0,this,true);
        bVar3 = ::operator==(&ON_MappingTag::Unset,(ON_MappingTag *)local_1d0);
        local_4c3 = false;
        if (!bVar3) {
          bVar5 = ::operator==(&ON_MappingTag::SurfaceParameterMapping,(ON_MappingTag *)local_1d0);
          local_4c5 = true;
          if (!bVar5) {
            local_4c6 = false;
            if (bVar2) {
              local_4c7 = true;
              if (mapping_tag.m_mapping_id.Data4._0_4_ != 1) {
                local_4c7 = ::operator==(&ON_MappingTag::SurfaceParameterMapping.m_mapping_id,
                                         (ON_UUID_struct *)local_1d0);
              }
              local_4c6 = local_4c7;
            }
            local_4c5 = local_4c6;
          }
          local_4c3 = local_4c5;
        }
        if ((OVar4 != FromMapping) || (bVar3)) {
          ON_TextLog::Print(text_log,L"Inactive TextureMappingTag()");
        }
        else {
          ON_TextLog::Print(text_log,L"TextureMappingTag()");
        }
        if (bVar3) {
          ON_TextLog::Print(text_log,L" = ON_MappingTag::Unset\n");
        }
        else if (local_4c3 == false) {
          ON_TextLog::Print(text_log,":\n");
          ON_TextLogIndent::ON_TextLogIndent
                    ((ON_TextLogIndent *)(subd_texture_settings_hash.m_digest + 0xc),text_log);
          ON_TextLog::Print(text_log,"m_mapping_type = ");
          switch(mapping_tag.m_mapping_id.Data4._0_4_) {
          case (BADTYPE)0x0:
            ON_TextLog::Print(text_log,"none");
            break;
          case (BADTYPE)0x1:
            ON_TextLog::Print(text_log,"srfp");
            break;
          case (BADTYPE)0x2:
            ON_TextLog::Print(text_log,"plane");
            break;
          case (BADTYPE)0x3:
            ON_TextLog::Print(text_log,"cylinder");
            break;
          case (BADTYPE)0x4:
            ON_TextLog::Print(text_log,"sphere");
            break;
          case (BADTYPE)0x5:
            ON_TextLog::Print(text_log,"box");
            break;
          case (BADTYPE)0x6:
            ON_TextLog::Print(text_log,"mesh primitive");
            break;
          case (BADTYPE)0x7:
            ON_TextLog::Print(text_log,"srf primitive");
            break;
          case (BADTYPE)0x8:
            ON_TextLog::Print(text_log,"brep primitive");
            break;
          case (BADTYPE)0x9:
            ON_TextLog::Print(text_log,"ocs");
            break;
          case (BADTYPE)0xa:
            ON_TextLog::Print(text_log,"false colors");
            break;
          case (BADTYPE)0xb:
            ON_TextLog::Print(text_log,"wcs projection");
            break;
          case (BADTYPE)0xc:
            ON_TextLog::Print(text_log,"wcs box projection");
          }
          ON_TextLog::PrintNewLine(text_log);
          ON_TextLog::Print(text_log,"m_mapping_id = ");
          ON_TextLog::Print(text_log,(ON_UUID *)local_1d0);
          bVar3 = ::operator==((ON_UUID_struct *)local_1d0,
                               &ON_MappingTag::SurfaceParameterMapping.m_mapping_id);
          if (bVar3) {
            ON_TextLog::Print(text_log," = ON_MappingTag::SurfaceParameterMapping.m_mapping_id");
          }
          ON_TextLog::PrintNewLine(text_log);
          ON_TextLog::Print(text_log,"m_mapping_crc = %08x\n",
                            (ulong)(uint)mapping_tag.m_mapping_id.Data4._4_4_);
          ON_TextLog::Print(text_log,"m_mesh_xform:\n");
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,(ON_Xform *)&mapping_tag.m_mapping_type);
          ON_TextLog::PopIndent(text_log);
          ON_TextLogIndent::~ON_TextLogIndent
                    ((ON_TextLogIndent *)(subd_texture_settings_hash.m_digest + 0xc));
        }
        else {
          ON_TextLog::Print(text_log,L" = ON_MappingTag::SurfaceParameterMapping\n");
        }
      }
      TextureSettingsHash((ON_SHA1_Hash *)(frament_texture_settings_hash.m_digest + 0xc),this);
      ON_TextLog::Print(text_log,L"TextureSettingsHash() = ");
      ON_SHA1_Hash::Dump((ON_SHA1_Hash *)(frament_texture_settings_hash.m_digest + 0xc),text_log);
      ON_TextLog::PrintNewLine(text_log);
      FragmentTextureCoordinatesTextureSettingsHash((ON_SHA1_Hash *)&indent1_1.m_bEnabled,this);
      ON_TextLog::Print(text_log,L"FragmentTextureCoordinatesTextureSettingsHash() = ");
      bVar3 = ::operator==((ON_SHA1_Hash *)(frament_texture_settings_hash.m_digest + 0xc),
                           (ON_SHA1_Hash *)&indent1_1.m_bEnabled);
      if (bVar3) {
        ON_TextLog::Print(text_log,L"TextureSettingsHash()");
      }
      else {
        ON_SHA1_Hash::Dump((ON_SHA1_Hash *)&indent1_1.m_bEnabled,text_log);
      }
      ON_TextLog::PrintNewLine(text_log);
      ON_wString::~ON_wString((ON_wString *)local_130);
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_110);
    }
    if (!bVar2) {
      ON_TextLog::Print(text_log,L"Per vertex color settings:\n");
      ON_TextLogIndent::ON_TextLogIndent
                ((ON_TextLogIndent *)(colors_tag.m_mesh_xform.m_xform[3] + 3),text_log);
      ON_TextLog::Print(text_log,L"ColorsMappingTag() = ");
      ColorsMappingTag((ON_MappingTag *)(subd_fragment_color_settings_hash.m_digest + 0xd),this);
      subd_fragment_color_settings_hash.m_digest[0xc] = ON_TextLog::DecreaseLevelOfDetail(text_log);
      ON_MappingTag::Dump((ON_MappingTag *)(subd_fragment_color_settings_hash.m_digest + 0xd),
                          text_log);
      ON_TextLog::SetLevelOfDetail(text_log,subd_fragment_color_settings_hash.m_digest[0xc]);
      FragmentColorsSettingsHash((ON_SHA1_Hash *)&indent1_2.field_0xb,this);
      ON_TextLog::Print(text_log,L"FragmentColorsSettingsHash() = ");
      ON_SHA1_Hash::Dump((ON_SHA1_Hash *)&indent1_2.field_0xb,text_log);
      ON_TextLog::PrintNewLine(text_log);
      ON_TextLogIndent::~ON_TextLogIndent
                ((ON_TextLogIndent *)(colors_tag.m_mesh_xform.m_xform[3] + 3));
    }
    indent1_2._10_1_ = 0;
    if (!bVar2) {
      ON_TextLog::Print(text_log,L"Geometry content serial number = %lu\n",local_470);
      ON_TextLog::Print(text_log,L"Render content serial number = %lu\n",local_478);
      ON_TextLog::Print(text_log,"Heap use:\n");
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&sizeof_subd,text_log);
      local_2e8 = SizeOfAllElements(this);
      ON_wString::ON_wString(&local_300,L"Total = ");
      ON_wString::ToMemorySize(&local_308,local_2e8);
      ON_wString::operator+(&local_2f8,&local_300);
      ON_wString::ON_wString((ON_wString *)&sizeof_frags,L".\n");
      ON_wString::operator+(&local_2f0,&local_2f8);
      ON_TextLog::PrintString(text_log,&local_2f0);
      ON_wString::~ON_wString(&local_2f0);
      ON_wString::~ON_wString((ON_wString *)&sizeof_frags);
      ON_wString::~ON_wString(&local_2f8);
      ON_wString::~ON_wString(&local_308);
      ON_wString::~ON_wString(&local_300);
      local_318 = SizeOfAllMeshFragments(this);
      ON_wString::ON_wString(&local_330,L"Mesh fragments = ");
      ON_wString::ToMemorySize(&local_338,local_318);
      ON_wString::operator+(&local_328,&local_330);
      ON_wString::ON_wString((ON_wString *)&sizeof_frags_waste,L".\n");
      ON_wString::operator+(&local_320,&local_328);
      ON_TextLog::PrintString(text_log,&local_320);
      ON_wString::~ON_wString(&local_320);
      ON_wString::~ON_wString((ON_wString *)&sizeof_frags_waste);
      ON_wString::~ON_wString(&local_328);
      ON_wString::~ON_wString(&local_338);
      ON_wString::~ON_wString(&local_330);
      local_348 = SizeOfUnusedMeshFragments(this);
      ON_wString::ON_wString(&local_360,L"Reserved but ununsed = ");
      Internal_DescribeWaste((size_t)&local_368,local_348);
      ON_wString::operator+(&local_358,&local_360);
      ON_wString::ON_wString((ON_wString *)&lit.m_level_count,L".\n");
      ON_wString::operator+(&local_350,&local_358);
      ON_TextLog::PrintString(text_log,&local_350);
      ON_wString::~ON_wString(&local_350);
      ON_wString::~ON_wString((ON_wString *)&lit.m_level_count);
      ON_wString::~ON_wString(&local_358);
      ON_wString::~ON_wString(&local_368);
      ON_wString::~ON_wString(&local_360);
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&sizeof_subd);
    }
    ON_TextLog::Print(text_log,L"Levels:\n");
    _empty_id_range = ON_SubDimple::LevelIterator(this_00);
    ON_2udex::ON_2udex((ON_2udex *)
                       &vidit.m_subd_ref.m_subd_sp.
                        super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       0xffffffff,0);
    ON_SubDVertexIdIterator::ON_SubDVertexIdIterator
              ((ON_SubDVertexIdIterator *)
               &eidit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,this);
    ON_SubDEdgeIdIterator::ON_SubDEdgeIdIterator
              ((ON_SubDEdgeIdIterator *)
               &fidit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,this);
    ON_SubDFaceIdIterator::ON_SubDFaceIdIterator((ON_SubDFaceIdIterator *)local_400,this);
    level._4_4_ = 0;
    indent1_3._8_8_ = ON_SubDLevelIterator::First((ON_SubDLevelIterator *)&empty_id_range);
    while (indent1_3._8_8_ != 0) {
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&level_vertex_id_range.j,text_log);
      if (indent1_3._8_8_ == 0) {
        level_vertex_id_range.i = 8;
      }
      else {
        if ((edge_id_range_local.j == 0) && (uVar1 != *(uint *)indent1_3._8_8_)) {
          local_528 = (ON_2udex *)
                      &vidit.m_subd_ref.m_subd_sp.
                       super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        else {
          local_528 = &edge_id_range_local;
        }
        vertex_id_range_00 = *local_528;
        if ((face_id_range_local.j == 0) && (uVar1 != *(uint *)indent1_3._8_8_)) {
          local_530 = (ON_2udex *)
                      &vidit.m_subd_ref.m_subd_sp.
                       super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        else {
          local_530 = &face_id_range_local;
        }
        edge_id_range_00 = *local_530;
        if ((uStack_30 == 0) && (uVar1 != *(uint *)indent1_3._8_8_)) {
          local_538 = (ON_2udex *)
                      &vidit.m_subd_ref.m_subd_sp.
                       super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        else {
          local_538 = (ON_2udex *)((long)&this_local + 4);
        }
        face_id_range_00 = *local_538;
        uVar6 = ON_SubDimple::MaximumVertexId(this_00);
        uVar7 = ON_SubDimple::MaximumEdgeId(this_00);
        uVar8 = ON_SubDimple::MaximumFaceId(this_00);
        uVar6 = ON_SubDLevel::DumpTopology
                          ((ON_SubDLevel *)indent1_3._8_8_,this,uVar6,uVar7,uVar8,vertex_id_range_00
                           ,edge_id_range_00,face_id_range_00,
                           (ON_SubDVertexIdIterator *)
                           &eidit.m_subd_ref.m_subd_sp.
                            super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           (ON_SubDEdgeIdIterator *)
                           &fidit.m_subd_ref.m_subd_sp.
                            super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           (ON_SubDFaceIdIterator *)local_400,(bool)(indent1_2._10_1_ & 1),text_log)
        ;
        level._4_4_ = uVar6 + level._4_4_;
        level_vertex_id_range.i = 0;
      }
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&level_vertex_id_range.j);
      indent1_3._8_8_ = ON_SubDLevelIterator::Next((ON_SubDLevelIterator *)&empty_id_range);
    }
    vertex_id_range_local.i = level._4_4_;
    level_vertex_id_range.i = 1;
    ON_SubDFaceIdIterator::~ON_SubDFaceIdIterator((ON_SubDFaceIdIterator *)local_400);
    ON_SubDEdgeIdIterator::~ON_SubDEdgeIdIterator
              ((ON_SubDEdgeIdIterator *)
               &fidit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ON_SubDVertexIdIterator::~ON_SubDVertexIdIterator
              ((ON_SubDVertexIdIterator *)
               &eidit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return vertex_id_range_local.i;
}

Assistant:

unsigned int ON_SubD::DumpTopology(
  ON_2udex vertex_id_range,
  ON_2udex edge_id_range,
  ON_2udex face_id_range,
  ON_TextLog& text_log
) const
{
  const class ON_SubDimple* subdimple = SubDimple();
  if (nullptr == subdimple)
  {
    text_log.Print(L"SubD: Empty\n");
    return 0;
  }

  const unsigned int level_count = LevelCount();
  const unsigned int active_level_index = ActiveLevel().m_level_index;

  const bool bIsTextHash = text_log.IsTextHash();

  // TextHash ignores settings that don't depend on 3dm file content.
  const ON__UINT64 runtime_sn = (bIsTextHash) ? 0 : RuntimeSerialNumber();
  const ON__UINT64 geometry_content_sn = (bIsTextHash) ? 0 : this->GeometryContentSerialNumber();
  const ON__UINT64 render_content_sn = (bIsTextHash) ? 0 : this->RenderContentSerialNumber();

  const unsigned subd_vertex_count = VertexCount();
  const unsigned subd_edge_count = EdgeCount();
  const unsigned subd_face_count = FaceCount();

  if (level_count > 1)
  {
    text_log.Print(L"SubD[%" PRIu64 "]: %u levels. Level %u is active (%u vertices, %u edges, %u faces).\n",
      runtime_sn,
      level_count,
      active_level_index,
      subd_vertex_count,
      subd_edge_count,
      subd_face_count
    );
  }
  else
  {
    text_log.Print(
      L"SubD[%" PRIu64 "]: %u vertices, %u edges, %u faces\n",
      runtime_sn,
      subd_vertex_count,
      subd_edge_count,
      subd_face_count
    );
  }

  ON_SubDEdgeSharpness subd_sharpness_range = ON_SubDEdgeSharpness::Smooth;
  const unsigned int subd_sharp_edge_count = SharpEdgeCount(subd_sharpness_range);
  if (subd_sharp_edge_count > 0)
  {
    text_log.PushIndent();
    if ( subd_sharpness_range.IsConstant() )
    {
      if (1 == subd_sharp_edge_count)
        text_log.Print(
          L"1 sharp edge with end sharpness = %g.\n",
          subd_sharpness_range[0]
        );
      else
        text_log.Print(
          L"%u sharp edges with end sharpness = %g.\n",
          subd_sharp_edge_count,
          subd_sharpness_range[0]
        );
    }
    else
    {
      text_log.Print(
        L"%u sharp edges with end sharpnesses from %g to %g.\n",
        subd_sharp_edge_count,
        subd_sharpness_range[0],
        subd_sharpness_range[1]
        );

    }
    text_log.PopIndent();
  }

  const ON_SubDHashType htype[] = {
    ON_SubDHashType::Topology,
    ON_SubDHashType::TopologyAndEdgeCreases,
    ON_SubDHashType::Geometry
  };

  for (size_t i = 0; i < sizeof(htype) / sizeof(htype[0]); ++i)
  {
    const ON_SubDHash h = this->SubDHash(htype[i], false);
    h.Dump(text_log);
  }


  if (false == bIsTextHash)
  {
    text_log.Print(L"Texture coordinate settings:\n");
    ON_TextLogIndent indent1(text_log);

    const ON_SubDTextureCoordinateType subd_texture_coordinate_type = this->TextureCoordinateType();
    const ON_wString subd_texture_coordinate_type_as_string = ON_SubD::TextureCoordinateTypeToString(this->TextureCoordinateType());
    text_log.Print(L"TextureCoordinateType() = %ls\n", static_cast<const wchar_t*>(subd_texture_coordinate_type_as_string));

    const bool bShowMappingTag
      = false == bIsTextHash
      || ON_SubDTextureCoordinateType::FromMapping == subd_texture_coordinate_type
      ;

    if (bShowMappingTag)
    {
      const ON_MappingTag mapping_tag = this->TextureMappingTag(true);

      const bool bUnsetMappingTag = ON_MappingTag::Unset == mapping_tag;

      const bool bSurfaceParameterMappingTag
        = false == bUnsetMappingTag
        && (
          ON_MappingTag::SurfaceParameterMapping == mapping_tag
          || (bIsTextHash && (ON_TextureMapping::TYPE::srfp_mapping == mapping_tag.m_mapping_type || ON_MappingTag::SurfaceParameterMapping.m_mapping_id == mapping_tag.m_mapping_id))
          )
        ;


      // NOTE: the mapping tag is only applied when subd_texture_coordinate_type = FromMapping
      if (ON_SubDTextureCoordinateType::FromMapping == subd_texture_coordinate_type && false == bUnsetMappingTag)
        text_log.Print(L"TextureMappingTag()");
      else
        text_log.Print(L"Inactive TextureMappingTag()");

      if (bUnsetMappingTag)
        text_log.Print(L" = ON_MappingTag::Unset\n");
      else if (bSurfaceParameterMappingTag)
        text_log.Print(L" = ON_MappingTag::SurfaceParameterMapping\n");
      else
      {
        text_log.Print(":\n");
        const ON_TextLogIndent indent2(text_log);
        text_log.Print("m_mapping_type = ");
        switch (mapping_tag.m_mapping_type)
        {
        case  ON_TextureMapping::TYPE::no_mapping:
          text_log.Print("none");
          break;
        case  ON_TextureMapping::TYPE::srfp_mapping:
          text_log.Print("srfp");
          break;
        case  ON_TextureMapping::TYPE::plane_mapping:
          text_log.Print("plane");
          break;
        case  ON_TextureMapping::TYPE::cylinder_mapping:
          text_log.Print("cylinder");
          break;
        case  ON_TextureMapping::TYPE::sphere_mapping:
          text_log.Print("sphere");
          break;
        case  ON_TextureMapping::TYPE::box_mapping:
          text_log.Print("box");
          break;
        case  ON_TextureMapping::TYPE::mesh_mapping_primitive:
          text_log.Print("mesh primitive");
          break;
        case  ON_TextureMapping::TYPE::srf_mapping_primitive:
          text_log.Print("srf primitive");
          break;
        case  ON_TextureMapping::TYPE::brep_mapping_primitive:
          text_log.Print("brep primitive");
          break;
        case  ON_TextureMapping::TYPE::ocs_mapping:
          text_log.Print("ocs");
          break;
        case  ON_TextureMapping::TYPE::false_colors:
          text_log.Print("false colors");
          break;
        case  ON_TextureMapping::TYPE::wcs_projection	:
          text_log.Print("wcs projection");
          break;
        case  ON_TextureMapping::TYPE::wcsbox_projection	:
          text_log.Print("wcs box projection");
          break;
        }
        text_log.PrintNewLine();
        text_log.Print("m_mapping_id = ");
        text_log.Print(mapping_tag.m_mapping_id);
        if (mapping_tag.m_mapping_id == ON_MappingTag::SurfaceParameterMapping.m_mapping_id)
          text_log.Print(" = ON_MappingTag::SurfaceParameterMapping.m_mapping_id");
        text_log.PrintNewLine();
        text_log.Print("m_mapping_crc = %08x\n", mapping_tag.m_mapping_crc);
        text_log.Print("m_mesh_xform:\n");
        text_log.PushIndent();
        text_log.Print(mapping_tag.m_mesh_xform);
        text_log.PopIndent();
      }
    }

    const ON_SHA1_Hash subd_texture_settings_hash = this->TextureSettingsHash();
    text_log.Print(L"TextureSettingsHash() = ");
    subd_texture_settings_hash.Dump(text_log);
    text_log.PrintNewLine();

    // runtime settings most recently used to set fragment texture coordinates.
    const ON_SHA1_Hash frament_texture_settings_hash = this->FragmentTextureCoordinatesTextureSettingsHash();
    text_log.Print(L"FragmentTextureCoordinatesTextureSettingsHash() = ");
    if (subd_texture_settings_hash == frament_texture_settings_hash)
      text_log.Print(L"TextureSettingsHash()");
    else
      frament_texture_settings_hash.Dump(text_log);
    text_log.PrintNewLine();
  }

  if (false == bIsTextHash)
  {
    text_log.Print(L"Per vertex color settings:\n");
    {
      ON_TextLogIndent indent1(text_log);
      text_log.Print(L"ColorsMappingTag() = ");
      const ON_MappingTag colors_tag = this->ColorsMappingTag();
      const ON_TextLog::LevelOfDetail lod = text_log.DecreaseLevelOfDetail();
      colors_tag.Dump(text_log);
      text_log.SetLevelOfDetail(lod);
      const ON_SHA1_Hash subd_fragment_color_settings_hash = this->FragmentColorsSettingsHash();
      text_log.Print(L"FragmentColorsSettingsHash() = ");
      subd_fragment_color_settings_hash.Dump(text_log);
      text_log.PrintNewLine();
    }
  }

  bool bIncludeSymmetrySet = false;

  if (false == bIsTextHash)
  {
    text_log.Print(L"Geometry content serial number = %" PRIu64 "\n", geometry_content_sn);
    text_log.Print(L"Render content serial number = %" PRIu64 "\n", render_content_sn);
    text_log.Print("Heap use:\n");
    {
      ON_TextLogIndent indent1(text_log);
      size_t sizeof_subd = this->SizeOfAllElements();
      text_log.PrintString(ON_wString(L"Total = ") + ON_wString::ToMemorySize(sizeof_subd) + ON_wString(L".\n"));
      const size_t sizeof_frags = this->SizeOfAllMeshFragments();
      text_log.PrintString(ON_wString(L"Mesh fragments = ") + ON_wString::ToMemorySize(sizeof_frags) + ON_wString(L".\n"));
      const size_t sizeof_frags_waste = this->SizeOfUnusedMeshFragments();
      text_log.PrintString(ON_wString(L"Reserved but ununsed = ")
        + Internal_DescribeWaste(sizeof_frags_waste, sizeof_subd)
        + ON_wString(L".\n"));
    }
  }

  text_log.Print(L"Levels:\n");

  ON_SubDLevelIterator lit(subdimple->LevelIterator());

  const ON_2udex empty_id_range(ON_UNSET_UINT_INDEX, 0);

  ON_SubDVertexIdIterator vidit(*this); 
  ON_SubDEdgeIdIterator eidit(*this); 
  ON_SubDFaceIdIterator fidit(*this);

  unsigned int error_count = 0;
  for (const ON_SubDLevel* level = lit.First(); nullptr != level; level = lit.Next())
  {
    ON_TextLogIndent indent1(text_log);
    if (nullptr == level)
      continue;
    ON_2udex level_vertex_id_range
      = (0 != vertex_id_range.j || active_level_index == level->m_level_index)
      ? vertex_id_range
      : empty_id_range;
    ON_2udex level_edge_id_range
      = (0 != edge_id_range.j || active_level_index == level->m_level_index)
      ? edge_id_range
      : empty_id_range;
    ON_2udex level_face_id_range
      = (0 != face_id_range.j || active_level_index == level->m_level_index)
      ? face_id_range
      : empty_id_range;

    error_count += level->DumpTopology(
      *this,
      subdimple->MaximumVertexId(),
      subdimple->MaximumEdgeId(),
      subdimple->MaximumFaceId(),
      level_vertex_id_range,
      level_edge_id_range, 
      level_face_id_range,
      vidit,
      eidit,
      fidit,
      bIncludeSymmetrySet,
      text_log);
  }

  return error_count;
}